

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O2

void __thiscall StringTest::Test11(StringTest *this)

{
  int iVar1;
  allocator<char> local_49;
  string t1;
  string t2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t1,"This is y a sentence with vowels.",(allocator<char> *)&t2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t2,"aeiou",&local_49);
  iVar1 = std::__cxx11::string::find_last_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2a4,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 0x1d) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ab,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((string *)&t1,(ulong)&t2);
  if (iVar1 != 0x1b) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b2,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)&t1,0x10899f);
  if (iVar1 != 0x16) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2b9,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_last_of((char *)&t1,0x1089dc,9);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c0,"Failed to find third vowel");
  }
  iVar1 = std::__cxx11::string::rfind((char)&t1,0x79);
  if (iVar1 != 8) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2c7,"Failed to find \'y\'");
  }
  iVar1 = std::__cxx11::string::rfind((char)&t1,0x73);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2ce,"Failed to find \'s\'");
  }
  iVar1 = std::__cxx11::string::rfind((char)&t1,0x73);
  if (iVar1 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x2d5,"Failed to find \'s\'");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  return;
}

Assistant:

void Test11()
	{
		// find_first_of
		string t1 = "This is y a sentence with vowels.";
		string t2 = "aeiou";
		
		unsigned i = t1.find_last_of( t2 );
		
		LOG_NOTICE( "i is %d", i );
		
		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 29 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 29 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_last_of( t2, 28 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 27 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiou", 26 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 22 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_last_of( "aeiouy", 9, 5 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 5 )
			TestFailed( "Failed to find third vowel" );

		i = t1.find_last_of( 'y' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 8 )
			TestFailed( "Failed to find \'y\'" );

		i = t1.find_last_of( 's' );

		LOG_NOTICE( "i is %d", i );

		if ( i != 31 )
			TestFailed( "Failed to find \'s\'" );

		i = t1.find_last_of( 's', 8 );

		LOG_NOTICE( "i is %d", i );

		if ( i != 6 )
			TestFailed( "Failed to find \'s\'" );
		
		TestPassed();
	}